

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::DistributionFunc::~DistributionFunc(DistributionFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~DistributionFunc((DistributionFunc *)0x78c668);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

DistributionFunc(KnownSystemName knownNameId, size_t numArgs) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), numArgs(numArgs) {
        hasOutputArgs = true;
    }